

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O0

void __thiscall timer::operator()(timer *this,error_code *e)

{
  canceler func;
  timer func_00;
  bool bVar1;
  undefined4 uVar2;
  ostream *poVar3;
  error_code *in_RSI;
  undefined8 *in_RDI;
  ptime pVar4;
  canceler c;
  ptime *in_stack_fffffffffffffe38;
  ptime *other;
  ptime *in_stack_fffffffffffffe40;
  ptime *this_00;
  error_code *in_stack_fffffffffffffe48;
  error_code *in_stack_fffffffffffffe50;
  ptime *this_01;
  ptime *ppVar5;
  callback<void_(const_std::error_code_&)> *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffec8;
  longlong local_f8;
  int local_f0;
  undefined4 local_e8;
  undefined8 uStack_e0;
  ptime *local_c8;
  ptime *ppStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  longlong local_a0;
  int local_98;
  longlong local_90;
  int local_88;
  longlong local_80;
  int local_78;
  undefined1 local_70 [12];
  undefined1 local_60 [12];
  longlong local_50;
  int local_48;
  undefined1 local_40 [12];
  undefined1 local_30 [12];
  error_code local_20 [2];
  
  if ((*(byte *)((long)in_RDI + 0x1c) & 1) == 0) {
    bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"!e");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x62);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    local_40 = booster::ptime::now();
    local_30 = local_40;
    bVar1 = booster::ptime::operator>=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"booster::ptime::now() >= t");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,99);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    *(undefined1 *)((long)in_RDI + 0x1c) = 1;
    ppVar5 = (ptime *)*in_RDI;
    local_70 = booster::ptime::now();
    local_60 = local_70;
    pVar4 = booster::ptime::seconds(0x1098b8);
    local_90 = pVar4.sec;
    local_88 = pVar4.nsec;
    local_80 = local_90;
    local_78 = local_88;
    pVar4 = booster::ptime::operator+(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_a0 = pVar4.sec;
    local_98 = pVar4.nsec;
    other = (ptime *)*in_RDI;
    this_00 = (ptime *)in_RDI[1];
    local_b8 = in_RDI[2];
    uStack_b0 = in_RDI[3];
    func_00.t.sec = in_stack_fffffffffffffeb8;
    func_00.srv = (io_service *)in_stack_fffffffffffffeb0;
    func_00.t.nsec = in_stack_fffffffffffffec0;
    func_00.t._12_4_ = in_stack_fffffffffffffec4;
    func_00.event_id = (int)in_stack_fffffffffffffec8;
    func_00.cancel = (bool)(char)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    func_00._29_3_ = (int3)((ulong)in_stack_fffffffffffffec8 >> 0x28);
    local_c8 = other;
    ppStack_c0 = this_00;
    local_50 = local_a0;
    local_48 = local_98;
    booster::callback<void_(const_std::error_code_&)>::callback<timer>
              (in_stack_fffffffffffffea0,func_00);
    uVar2 = booster::aio::io_service::set_timer_event(ppVar5,(callback *)&local_50);
    *(undefined4 *)(in_RDI + 3) = uVar2;
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x1099a8);
    local_e8 = *(undefined4 *)(in_RDI + 3);
    uStack_e0 = *in_RDI;
    this_01 = (ptime *)*in_RDI;
    booster::ptime::now();
    booster::ptime::milliseconds((longlong)this_00);
    pVar4 = booster::ptime::operator+(this_00,other);
    local_f8 = pVar4.sec;
    local_f0 = pVar4.nsec;
    func.srv = (io_service *)ppVar5;
    func._0_8_ = &stack0xfffffffffffffeb0;
    booster::callback<void_(const_std::error_code_&)>::callback<timer::canceler>
              ((callback<void_(const_std::error_code_&)> *)this_01,func);
    booster::aio::io_service::set_timer_event(this_01,(callback *)&local_f8);
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x109abd);
  }
  else {
    std::error_code::error_code(local_20,1,booster::aio::aio_error_cat);
    bVar1 = std::operator==(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,
                               "e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat)"
                              );
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5d);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    booster::aio::io_service::stop();
    timer_done = true;
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		if(cancel) {
			TEST(e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat));
			srv->stop();
			timer_done = true;
		}
		else {
			TEST(!e);
			TEST(booster::ptime::now() >= t);
			cancel=true;
			event_id = srv->set_timer_event(booster::ptime::now() + ptime::seconds(10),*this);
			canceler c = {event_id,srv};
			srv->set_timer_event(booster::ptime::now() + ptime::milliseconds(100),c);
		}

	}